

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_StateDescriptor.cpp
# Opt level: O2

void __thiscall
amrex::StateDescriptor::StateDescriptor
          (StateDescriptor *this,IndexType btyp,TimeCenter ttyp,int ident,int nextra,int num_comp,
          InterpBase *a_interp,bool a_extrap,bool a_store_in_checkpoint)

{
  size_type __new_size;
  
  (this->type).itype = btyp.itype;
  this->t_type = ttyp;
  this->id = ident;
  this->ncomp = num_comp;
  this->ngrow = nextra;
  this->mapper = a_interp;
  this->m_extrap = a_extrap;
  this->m_store_in_checkpoint = a_store_in_checkpoint;
  __new_size = (size_type)num_comp;
  memset(&this->names,0,0xc0);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::resize(&(this->names).
            super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ,__new_size);
  std::vector<amrex::BCRec,_std::allocator<amrex::BCRec>_>::resize
            (&(this->bc).super_vector<amrex::BCRec,_std::allocator<amrex::BCRec>_>,__new_size);
  std::
  vector<std::unique_ptr<amrex::StateDescriptor::BndryFunc,_std::default_delete<amrex::StateDescriptor::BndryFunc>_>,_std::allocator<std::unique_ptr<amrex::StateDescriptor::BndryFunc,_std::default_delete<amrex::StateDescriptor::BndryFunc>_>_>_>
  ::resize(&(this->bc_func).
            super_vector<std::unique_ptr<amrex::StateDescriptor::BndryFunc,_std::default_delete<amrex::StateDescriptor::BndryFunc>_>,_std::allocator<std::unique_ptr<amrex::StateDescriptor::BndryFunc,_std::default_delete<amrex::StateDescriptor::BndryFunc>_>_>_>
           ,__new_size);
  std::vector<amrex::InterpBase_*,_std::allocator<amrex::InterpBase_*>_>::resize
            (&(this->mapper_comp).
              super_vector<amrex::InterpBase_*,_std::allocator<amrex::InterpBase_*>_>,__new_size);
  std::vector<int,_std::allocator<int>_>::resize
            (&(this->m_primary).super_vector<int,_std::allocator<int>_>,__new_size);
  std::vector<int,_std::allocator<int>_>::resize
            (&(this->m_groupsize).super_vector<int,_std::allocator<int>_>,__new_size);
  std::vector<int,_std::allocator<int>_>::resize
            (&(this->max_map_start_comp).super_vector<int,_std::allocator<int>_>,__new_size);
  std::vector<int,_std::allocator<int>_>::resize
            (&(this->min_map_end_comp).super_vector<int,_std::allocator<int>_>,__new_size);
  return;
}

Assistant:

StateDescriptor::StateDescriptor (IndexType                   btyp,
                                  StateDescriptor::TimeCenter ttyp,
                                  int                         ident,
                                  int                         nextra,
                                  int                         num_comp,
                                  InterpBase*                 a_interp,
                                  bool                        a_extrap,
                                  bool                        a_store_in_checkpoint)
    :
    type(btyp),
    t_type(ttyp),
    id(ident),
    ncomp(num_comp),
    ngrow(nextra),
    mapper(a_interp),
    m_extrap(a_extrap),
    m_store_in_checkpoint(a_store_in_checkpoint)
{
    BL_ASSERT (num_comp > 0);

    names.resize(num_comp);
    bc.resize(num_comp);
    bc_func.resize(num_comp);
    mapper_comp.resize(num_comp);
    m_primary.resize(num_comp);
    m_groupsize.resize(num_comp);
    max_map_start_comp.resize(num_comp);
    min_map_end_comp.resize(num_comp);
}